

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentation.cxx
# Opt level: O2

void __thiscall cmDocumentation::addCPackStandardDocSections(cmDocumentation *this)

{
  cmDocumentationSection sec;
  cmDocumentationSection cStack_48;
  
  cmDocumentationSection::cmDocumentationSection(&cStack_48,"Generators");
  cmDocumentationSection::Append(&cStack_48,cmDocumentationCPackGeneratorsHeader);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmDocumentationSection>,std::_Select1st<std::pair<std::__cxx11::string_const,cmDocumentationSection>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmDocumentationSection>>>
  ::_M_emplace_unique<char_const(&)[11],cmDocumentationSection>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmDocumentationSection>,std::_Select1st<std::pair<std::__cxx11::string_const,cmDocumentationSection>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmDocumentationSection>>>
              *)&this->AllSections,(char (*) [11])0x6290bb,&cStack_48);
  cmDocumentationSection::~cmDocumentationSection(&cStack_48);
  return;
}

Assistant:

void cmDocumentation::addCPackStandardDocSections()
{
  cmDocumentationSection sec{ "Generators" };
  sec.Append(cmDocumentationCPackGeneratorsHeader);
  this->AllSections.emplace("Generators", std::move(sec));
}